

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_setup_multiple_outputs2(APITests *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  allocator_type local_8a;
  allocator_type local_89;
  _Vector_base<int,_std::allocator<int>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  int local_58 [2];
  string local_50;
  string local_30;
  
  GPIO::setmode(BOARD);
  std::__cxx11::to_string(&local_50,(this->pin_data).out_a);
  std::__cxx11::to_string(&local_30,(this->pin_data).out_b);
  __l._M_len = 2;
  __l._M_array = &local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,__l,&local_89);
  local_58[0] = 0;
  local_58[1] = 1;
  __l_00._M_len = 2;
  __l_00._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,__l_00,&local_8a);
  GPIO::setup((vector *)&local_70,OUT,(vector *)&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_50._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_multiple_outputs2()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup({std::to_string(pin_data.out_a), std::to_string(pin_data.out_b)}, GPIO::OUT, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }